

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitIfExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,IfExpr *expr)

{
  string *psVar1;
  Expr *pEVar2;
  BlockExpr *pBVar3;
  ostream *poVar4;
  undefined1 *puVar5;
  string asStack_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  psVar1 = &this->m_ident;
  poVar4 = std::operator<<(local_1a8,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"(Expr::If ");
  puVar5 = &this->field_0x8;
  pEVar2 = (expr->condition)._M_t.
           super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(asStack_1d8,pEVar2,puVar5);
  poVar4 = std::operator<<(poVar4,asStack_1d8);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::string::append((char *)psVar1);
  pBVar3 = (expr->thenBody)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar3->super_Expr)._vptr_Expr[2])(asStack_1d8,pBVar3,puVar5);
  poVar4 = std::operator<<(local_1a8,asStack_1d8);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(asStack_1d8);
  pBVar3 = (expr->elseBody)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar3->super_Expr)._vptr_Expr[2])(asStack_1d8,pBVar3,puVar5);
  poVar4 = std::operator<<(local_1a8,asStack_1d8);
  std::operator<<(poVar4,')');
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::string::erase((ulong)psVar1,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitIfExpr(IfExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::If " << visitExpr(*expr.condition) << '\n';
        m_ident += "    ";

        s << visitExpr(*expr.thenBody) << '\n';
        s << visitExpr(*expr.elseBody) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }